

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::Options
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this,RegexFlags *flags)

{
  EncodedChar EVar1;
  EncodedChar *pEVar2;
  RegexFlags RVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  undefined4 *puVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  RegexFlags RVar12;
  uint uVar14;
  RegexFlags RVar13;
  
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    if (this->inputLim < this->next) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar5) goto LAB_00ed299d;
      *puVar7 = 0;
    }
    pEVar2 = this->next;
    EVar1 = *pEVar2;
    uVar6 = (uint)(ushort)EVar1;
    iVar11 = 1;
    if (EVar1 == L'\\') {
      if (pEVar2 + 6 <= this->inputLim) {
        if (this->inputLim < pEVar2 + 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar5) goto LAB_00ed299d;
          *puVar7 = 0;
        }
        if (this->next[1] == L'u') {
          if (this->inputLim < this->next + 2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
            if (!bVar5) goto LAB_00ed299d;
            *puVar7 = 0;
          }
          uVar8 = (ulong)(ushort)this->next[2];
          if ((uVar8 < 0x100) && ((ASCIIChars::classes[uVar8] & 0x40) != 0)) {
            if (this->inputLim < this->next + 3) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar7 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                 ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
              if (!bVar5) goto LAB_00ed299d;
              *puVar7 = 0;
            }
            uVar8 = (ulong)(ushort)this->next[3];
            if ((uVar8 < 0x100) && ((ASCIIChars::classes[uVar8] & 0x40) != 0)) {
              if (this->inputLim < this->next + 4) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar7 = 1;
                bVar5 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                   ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
                if (!bVar5) goto LAB_00ed299d;
                *puVar7 = 0;
              }
              uVar8 = (ulong)(ushort)this->next[4];
              if ((uVar8 < 0x100) && ((ASCIIChars::classes[uVar8] & 0x40) != 0)) {
                if (this->inputLim < this->next + 5) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar7 = 1;
                  bVar5 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                     ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
                  if (!bVar5) goto LAB_00ed299d;
                  *puVar7 = 0;
                }
                uVar8 = (ulong)(ushort)this->next[5];
                if ((uVar8 < 0x100) && ((ASCIIChars::classes[uVar8] & 0x40) != 0)) {
                  if (((this->scriptContext->config).threadConfig)->m_ES6Unicode != false)
                  goto LAB_00ed2982;
                  if (this->inputLim < this->next + 2) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar7 = 1;
                    bVar5 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
                    if (!bVar5) {
LAB_00ed299d:
                      pcVar4 = (code *)invalidInstructionException();
                      (*pcVar4)();
                    }
                    *puVar7 = 0;
                  }
                  uVar8 = (ulong)(ushort)this->next[2];
                  uVar14 = 0;
                  if (uVar8 < 0x100) {
                    uVar14 = (uint)(byte)ASCIIChars::values[uVar8] << 0xc;
                  }
                  if (this->inputLim < this->next + 3) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar7 = 1;
                    bVar5 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
                    if (!bVar5) goto LAB_00ed299d;
                    *puVar7 = 0;
                  }
                  uVar8 = (ulong)(ushort)this->next[3];
                  uVar9 = 0;
                  if (uVar8 < 0x100) {
                    uVar9 = (uint)(byte)ASCIIChars::values[uVar8] << 8;
                  }
                  if (this->inputLim < this->next + 4) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar7 = 1;
                    bVar5 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
                    if (!bVar5) goto LAB_00ed299d;
                    *puVar7 = 0;
                  }
                  uVar8 = (ulong)(ushort)this->next[4];
                  uVar10 = 0;
                  if (uVar8 < 0x100) {
                    uVar10 = (uint)(byte)ASCIIChars::values[uVar8] << 4;
                  }
                  if (this->inputLim < this->next + 5) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar7 = 1;
                    bVar5 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
                    if (!bVar5) goto LAB_00ed299d;
                    *puVar7 = 0;
                  }
                  uVar6 = 0;
                  if ((ulong)(ushort)this->next[5] < 0x100) {
                    uVar6 = (uint)(byte)ASCIIChars::values[(ushort)this->next[5]];
                  }
                  uVar10 = uVar9 | uVar14 | uVar10;
                  if (0xffff < uVar10) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar7 = 1;
                    bVar5 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                                       ,0x89,"(u <= MaxUChar)","u <= MaxUChar");
                    if (!bVar5) goto LAB_00ed299d;
                    *puVar7 = 0;
                  }
                  uVar6 = uVar6 | uVar10;
                  iVar11 = 6;
                }
              }
            }
          }
        }
      }
    }
    else if (EVar1 == L'\0') {
      return;
    }
    uVar6 = uVar6 & 0xffff;
    switch(uVar6 - 0x67 >> 1 | (uint)((uVar6 - 0x67 & 1) != 0) << 0x1f) {
    case 0:
      RVar13 = GlobalRegexFlag;
      RVar12 = GlobalRegexFlag;
      RVar3 = *flags & GlobalRegexFlag;
      break;
    case 1:
      RVar13 = IgnoreCaseRegexFlag;
      RVar12 = IgnoreCaseRegexFlag;
      RVar3 = *flags & IgnoreCaseRegexFlag;
      break;
    default:
switchD_00ed2880_caseD_2:
      if ((0xff < uVar6) || ((ASCIIChars::classes[uVar6] & 1) == 0)) {
        return;
      }
LAB_00ed2982:
      Fail(this,-0x7ff5ec67);
      return;
    case 3:
      RVar13 = MultilineRegexFlag;
      RVar12 = MultilineRegexFlag;
      RVar3 = *flags & MultilineRegexFlag;
      break;
    case 6:
      if (((this->scriptContext->config).threadConfig)->m_ES2018RegExDotAll != true)
      goto switchD_00ed2880_caseD_7;
      RVar13 = DotAllRegexFlag;
      RVar12 = DotAllRegexFlag;
      RVar3 = *flags & DotAllRegexFlag;
      break;
    case 7:
switchD_00ed2880_caseD_7:
      if (((this->scriptContext->config).threadConfig)->m_ES6Unicode != true)
      goto switchD_00ed2880_caseD_9;
      RVar13 = UnicodeRegexFlag;
      RVar12 = UnicodeRegexFlag;
      RVar3 = *flags & UnicodeRegexFlag;
      break;
    case 9:
switchD_00ed2880_caseD_9:
      if (((this->scriptContext->config).threadConfig)->m_ES6RegExSticky != true)
      goto switchD_00ed2880_caseD_2;
      RVar13 = StickyRegexFlag;
      RVar12 = StickyRegexFlag;
      RVar3 = *flags & StickyRegexFlag;
    }
    if (RVar3 != NoRegexFlags) {
      Fail(this,-0x7ff5ec67);
      RVar12 = RVar13;
    }
    *flags = *flags | RVar12;
    if (this->inputLim < (EncodedChar *)((ulong)(uint)(iVar11 * 2) + (long)this->next)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar5) goto LAB_00ed299d;
      *puVar7 = 0;
    }
    this->next = (EncodedChar *)((long)this->next + (ulong)(uint)(iVar11 * 2));
  } while( true );
}

Assistant:

void Parser<P, IsLiteral>::Options(RegexFlags& flags)
    {
        while (true)
        {
            // Could be terminating 0
            EncodedChar ec = ECLookahead();
            CharCount consume;
            Char c;

            if (ec == 0)
                // Embedded 0 not valid
                return;
            else if (IsLiteral &&
                ec == '\\' &&
                ECCanConsume(6) &&
                ECLookahead(1) == 'u' &&
                standardEncodedChars->IsHex(ECLookahead(2)) &&
                standardEncodedChars->IsHex(ECLookahead(3)) &&
                standardEncodedChars->IsHex(ECLookahead(4)) &&
                standardEncodedChars->IsHex(ECLookahead(5)))
            {
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    Fail(JSERR_RegExpSyntax);
                    return;
                }
                else
                {
                    uint32 n = (standardEncodedChars->DigitValue(ECLookahead(2)) << 12) |
                               (standardEncodedChars->DigitValue(ECLookahead(3)) << 8) |
                               (standardEncodedChars->DigitValue(ECLookahead(4)) << 4) |
                               (standardEncodedChars->DigitValue(ECLookahead(5)));
                    c = UTC(n);
                    consume = 6;
                }
            }
            else
            {
                c = Chars<EncodedChar>::CTW(ec);
                consume = 1;
            }

            switch (c) {
            case 'i':
                if ((flags & IgnoreCaseRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | IgnoreCaseRegexFlag);
                break;
            case 'g':
                if ((flags & GlobalRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | GlobalRegexFlag);
                break;
            case 'm':
                if ((flags & MultilineRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | MultilineRegexFlag);
                break;
            case 's':
                if (scriptContext->GetConfig()->IsES2018RegExDotAllEnabled())
                {
                    if ((flags & DotAllRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | DotAllRegexFlag);
                    break;
                }
            case 'u':
                // If we don't have unicode enabled, fall through to default
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    if ((flags & UnicodeRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | UnicodeRegexFlag);
                    // For telemetry
                    CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, UnicodeRegexFlag, scriptContext);

                    break;
                }
            case 'y':
                if (scriptContext->GetConfig()->IsES6RegExStickyEnabled())
                {
                    if ((flags & StickyRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | StickyRegexFlag);
                    // For telemetry
                    CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, StickyRegexFlag, scriptContext);

                    break;
                }
            default:
                if (standardChars->IsWord(c))
                {
                    // Outer context could never parse this character. Signal the syntax error as
                    // being part of the regex.
                    Fail(JSERR_RegExpSyntax);
                }
                return;
            }

            ECConsume(consume);
        }
    }